

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O3

char * gotcha_getenv(char *name)

{
  char cVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  lVar4 = -1;
  lVar3 = -0x100000000;
  do {
    lVar3 = lVar3 + 0x100000000;
    lVar6 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while (name[lVar6] != '\0');
  lVar6 = *___environ;
  if (lVar6 != 0) {
    plVar5 = ___environ;
    do {
      if (0 < (int)(uint)lVar4) {
        uVar8 = 0;
        do {
          cVar1 = name[uVar8];
          cVar2 = *(char *)(lVar6 + uVar8);
          if (cVar1 == '\0') {
            uVar7 = (uint)(cVar2 != '\0');
LAB_00103dac:
            if (uVar7 != 0) goto LAB_00103db8;
            break;
          }
          if (cVar1 != cVar2) {
            uVar7 = (int)cVar1 - (int)cVar2;
            goto LAB_00103dac;
          }
          uVar8 = uVar8 + 1;
        } while (((uint)lVar4 & 0x7fffffff) != uVar8);
      }
      if (*(char *)(lVar6 + (lVar3 >> 0x20)) == '=') {
        return (char *)(lVar6 + (lVar3 >> 0x20) + 1);
      }
LAB_00103db8:
      lVar6 = plVar5[1];
      plVar5 = plVar5 + 1;
    } while (lVar6 != 0);
  }
  return (char *)0x0;
}

Assistant:

char *gotcha_getenv(const char *name) 
{
   char **s;
   int name_len;

   name_len = gotcha_strlen(name);
   for (s = __environ; *s; s++) {
      if (gotcha_strncmp(name, *s, name_len) != 0)
         continue;
      if ((*s)[name_len] != '=')
         continue;
      return (*s) + name_len + 1;
   }
   return NULL;
}